

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O0

void arg_end_errorfn(void *parent,FILE *fp,int error,char *argval,char *progname)

{
  char *local_40;
  char *local_38;
  char *progname_local;
  char *argval_local;
  int error_local;
  FILE *fp_local;
  void *parent_local;
  
  local_38 = progname;
  if (progname == (char *)0x0) {
    local_38 = "";
  }
  local_40 = argval;
  if (argval == (char *)0x0) {
    local_40 = "";
  }
  fprintf((FILE *)fp,"%s: ",local_38);
  switch(error) {
  case 1:
    fputs("too many errors to display",(FILE *)fp);
    break;
  case 2:
    fputs("insufficent memory",(FILE *)fp);
    break;
  case 3:
    fprintf((FILE *)fp,"unexpected argument \"%s\"",local_40);
    break;
  case 4:
    fprintf((FILE *)fp,"invalid option \"%s\"",local_40);
    break;
  case 5:
    fprintf((FILE *)fp,"option \"%s\" requires an argument",local_40);
    break;
  default:
    fprintf((FILE *)fp,"invalid option \"-%c\"",(ulong)(uint)error);
  }
  fputc(10,(FILE *)fp);
  return;
}

Assistant:

static void arg_end_errorfn(
	void * parent,
	FILE * fp,
	int error,
	const char * argval,
	const char * progname) {
	/* suppress unreferenced formal parameter warning */
	(void)parent;

	progname = progname ? progname : "";
	argval = argval ? argval : "";

	fprintf(fp, "%s: ", progname);

	switch (error) {
		case ARG_ELIMIT:
			fputs("too many errors to display", fp);
			break;

		case ARG_EMALLOC:
			fputs("insufficent memory", fp);
			break;

		case ARG_ENOMATCH:
			fprintf(fp, "unexpected argument \"%s\"", argval);
			break;

		case ARG_EMISSARG:
			fprintf(fp, "option \"%s\" requires an argument", argval);
			break;

		case ARG_ELONGOPT:
			fprintf(fp, "invalid option \"%s\"", argval);
			break;

		default:
			fprintf(fp, "invalid option \"-%c\"", error);
			break;
	}

	fputc('\n', fp);
}